

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O2

void __thiscall
cmQtAutoGenerator::Logger::ErrorCommand
          (Logger *this,GenT genType,string *message,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *command,string *output)

{
  string *__lhs;
  lock_guard<std::mutex> lock;
  allocator<char> local_89;
  string msg;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  msg._M_dataplus._M_p = (pointer)&msg.field_2;
  msg._M_string_length = 0;
  msg.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::push_back((char)&msg);
  __lhs = cmQtAutoGen::GeneratorName_abi_cxx11_(genType);
  std::operator+(&local_48,__lhs," subprocess error");
  HeadLine(&local_68,&local_48);
  std::__cxx11::string::append((string *)&msg);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::append((string *)&msg);
  if (msg._M_dataplus._M_p[msg._M_string_length - 1] != '\n') {
    std::__cxx11::string::push_back((char)&msg);
  }
  std::__cxx11::string::push_back((char)&msg);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"Command",&local_89);
  HeadLine(&local_68,&local_48);
  std::__cxx11::string::append((string *)&msg);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  cmQtAutoGen::QuotedCommand(&local_68,command);
  std::__cxx11::string::append((string *)&msg);
  std::__cxx11::string::~string((string *)&local_68);
  if (msg._M_dataplus._M_p[msg._M_string_length - 1] != '\n') {
    std::__cxx11::string::push_back((char)&msg);
  }
  std::__cxx11::string::push_back((char)&msg);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"Output",&local_89);
  HeadLine(&local_68,&local_48);
  std::__cxx11::string::append((string *)&msg);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::append((string *)&msg);
  if (msg._M_dataplus._M_p[msg._M_string_length - 1] != '\n') {
    std::__cxx11::string::push_back((char)&msg);
  }
  std::__cxx11::string::push_back((char)&msg);
  std::mutex::lock(&this->Mutex_);
  cmSystemTools::Stderr(&msg);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  std::__cxx11::string::~string((string *)&msg);
  return;
}

Assistant:

void cmQtAutoGenerator::Logger::ErrorCommand(
  GenT genType, std::string const& message,
  std::vector<std::string> const& command, std::string const& output) const
{
  std::string msg;
  msg.push_back('\n');
  msg += HeadLine(GeneratorName(genType) + " subprocess error");
  msg += message;
  if (msg.back() != '\n') {
    msg.push_back('\n');
  }
  msg.push_back('\n');
  msg += HeadLine("Command");
  msg += QuotedCommand(command);
  if (msg.back() != '\n') {
    msg.push_back('\n');
  }
  msg.push_back('\n');
  msg += HeadLine("Output");
  msg += output;
  if (msg.back() != '\n') {
    msg.push_back('\n');
  }
  msg.push_back('\n');
  {
    std::lock_guard<std::mutex> lock(Mutex_);
    cmSystemTools::Stderr(msg);
  }
}